

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  char cVar1;
  size_t sVar2;
  FileInfo *pFVar3;
  ulong uVar4;
  size_t sVar5;
  shared_lock<std::shared_mutex> lock;
  
  lock._M_owns = true;
  lock._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  pFVar3 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                     (this,(BufferID)(location._0_4_ & 0xfffffff),&lock);
  if ((pFVar3 == (FileInfo *)0x0) || (pFVar3->data == (FileData *)0x0)) {
    sVar5 = 0;
  }
  else {
    sVar2 = 1;
    uVar4 = (ulong)location >> 0x1c;
    do {
      sVar5 = sVar2;
      if ((uVar4 == 0) ||
         (cVar1 = (pFVar3->data->mem).super_SmallVectorBase<char>.data_[uVar4 - 1], cVar1 == '\r'))
      break;
      sVar2 = sVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (cVar1 != '\n');
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  return sVar5;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(location.buffer(), lock);
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    SLANG_ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}